

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O0

bool __thiscall
bitfoot::Bitfoot::SetEngineOption(Bitfoot *this,string *optionName,string *optionValue)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t iVar5;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [40];
  string *optionValue_local;
  string *optionName_local;
  Bitfoot *this_local;
  
  local_48._32_8_ = optionValue;
  optionValue_local = optionName;
  optionName_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_48);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcasecmp(pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)local_48);
  if ((iVar2 == 0) &&
     (bVar1 = senjo::EngineOption::SetValue((EngineOption *)_optHash,(string *)local_48._32_8_),
     bVar1)) {
    iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
    SetHashSize(this,iVar5);
    this_local._7_1_ = true;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_68);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcasecmp(pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)local_68);
    if (iVar2 == 0) {
      ClearHash(this);
      this_local._7_1_ = true;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_88);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcasecmp(pcVar3,pcVar4);
      std::__cxx11::string::~string((string *)local_88);
      if ((iVar2 == 0) &&
         (bVar1 = senjo::EngineOption::SetValue
                            ((EngineOption *)_optContempt,(string *)local_48._32_8_), bVar1)) {
        iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
        _contempt = (undefined4)iVar5;
        this_local._7_1_ = true;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_a8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar2 = strcasecmp(pcVar3,pcVar4);
        std::__cxx11::string::~string((string *)local_a8);
        if ((iVar2 == 0) &&
           (bVar1 = senjo::EngineOption::SetValue
                              ((EngineOption *)_optDelta,(string *)local_48._32_8_), bVar1)) {
          iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
          _delta = (undefined4)iVar5;
          this_local._7_1_ = true;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_c8);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iVar2 = strcasecmp(pcVar3,pcVar4);
          std::__cxx11::string::~string((string *)local_c8);
          if ((iVar2 == 0) &&
             (bVar1 = senjo::EngineOption::SetValue
                                ((EngineOption *)_optEXT,(string *)local_48._32_8_), bVar1)) {
            senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_e8);
            _ext = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)_TRUE_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_e8);
            this_local._7_1_ = true;
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::c_str();
            senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_108);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcasecmp(pcVar3,pcVar4);
            std::__cxx11::string::~string((string *)local_108);
            if ((iVar2 == 0) &&
               (bVar1 = senjo::EngineOption::SetValue
                                  ((EngineOption *)_optFutility,(string *)local_48._32_8_), bVar1))
            {
              iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
              _futility = (undefined4)iVar5;
              this_local._7_1_ = true;
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_128);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              iVar2 = strcasecmp(pcVar3,pcVar4);
              std::__cxx11::string::~string((string *)local_128);
              if ((iVar2 == 0) &&
                 (bVar1 = senjo::EngineOption::SetValue
                                    ((EngineOption *)_optIID,(string *)local_48._32_8_), bVar1)) {
                senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_148);
                _iid = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_148,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)_TRUE_abi_cxx11_);
                std::__cxx11::string::~string((string *)local_148);
                this_local._7_1_ = true;
              }
              else {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_168);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                iVar2 = strcasecmp(pcVar3,pcVar4);
                std::__cxx11::string::~string((string *)local_168);
                if ((iVar2 == 0) &&
                   (bVar1 = senjo::EngineOption::SetValue
                                      ((EngineOption *)_optLMR,(string *)local_48._32_8_), bVar1)) {
                  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_188);
                  _lmr = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_188,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)_TRUE_abi_cxx11_);
                  std::__cxx11::string::~string((string *)local_188);
                  this_local._7_1_ = true;
                }
                else {
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_1a8);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  iVar2 = strcasecmp(pcVar3,pcVar4);
                  std::__cxx11::string::~string((string *)local_1a8);
                  if ((iVar2 == 0) &&
                     (bVar1 = senjo::EngineOption::SetValue
                                        ((EngineOption *)_optNMP,(string *)local_48._32_8_), bVar1))
                  {
                    senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_1c8);
                    _nmp = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_1c8,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)_TRUE_abi_cxx11_);
                    std::__cxx11::string::~string((string *)local_1c8);
                    this_local._7_1_ = true;
                  }
                  else {
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_1e8);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    iVar2 = strcasecmp(pcVar3,pcVar4);
                    std::__cxx11::string::~string((string *)local_1e8);
                    if ((iVar2 == 0) &&
                       (bVar1 = senjo::EngineOption::SetValue
                                          ((EngineOption *)_optNMR,(string *)local_48._32_8_), bVar1
                       )) {
                      senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_208);
                      _nmr = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_208,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)_TRUE_abi_cxx11_);
                      std::__cxx11::string::~string((string *)local_208);
                      this_local._7_1_ = true;
                    }
                    else {
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_228);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      iVar2 = strcasecmp(pcVar3,pcVar4);
                      std::__cxx11::string::~string((string *)local_228);
                      if ((iVar2 == 0) &&
                         (bVar1 = senjo::EngineOption::SetValue
                                            ((EngineOption *)_optOneReply,(string *)local_48._32_8_)
                         , bVar1)) {
                        senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_248);
                        _oneReply = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_248,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)_TRUE_abi_cxx11_);
                        std::__cxx11::string::~string((string *)local_248);
                        this_local._7_1_ = true;
                      }
                      else {
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_268);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        iVar2 = strcasecmp(pcVar3,pcVar4);
                        std::__cxx11::string::~string((string *)local_268);
                        if ((iVar2 == 0) &&
                           (bVar1 = senjo::EngineOption::SetValue
                                              ((EngineOption *)_optRZR,(string *)local_48._32_8_),
                           bVar1)) {
                          iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
                          _rzr = (undefined4)iVar5;
                          this_local._7_1_ = true;
                        }
                        else {
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_288);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          iVar2 = strcasecmp(pcVar3,pcVar4);
                          std::__cxx11::string::~string((string *)local_288);
                          if ((iVar2 == 0) &&
                             (bVar1 = senjo::EngineOption::SetValue
                                                ((EngineOption *)_optTempo,(string *)local_48._32_8_
                                                ), bVar1)) {
                            iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
                            _tempo = (undefined4)iVar5;
                            this_local._7_1_ = true;
                          }
                          else {
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            senjo::EngineOption::GetName_abi_cxx11_((EngineOption *)local_2a8);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            iVar2 = strcasecmp(pcVar3,pcVar4);
                            std::__cxx11::string::~string((string *)local_2a8);
                            if ((iVar2 == 0) &&
                               (bVar1 = senjo::EngineOption::SetValue
                                                  ((EngineOption *)_optTest,
                                                   (string *)local_48._32_8_), bVar1)) {
                              iVar5 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
                              _test = (undefined4)iVar5;
                              this_local._7_1_ = true;
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Bitfoot::SetEngineOption(const std::string& optionName,
                             const std::string& optionValue)
{
  if (!stricmp(optionName.c_str(), _optHash.GetName().c_str())) {
    if (_optHash.SetValue(optionValue)) {
      SetHashSize(_optHash.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optClearHash.GetName().c_str())) {
    ClearHash();
    return true;
  }
  if (!stricmp(optionName.c_str(), _optContempt.GetName().c_str())) {
    if (_optContempt.SetValue(optionValue)) {
      _contempt = static_cast<int>(_optContempt.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optDelta.GetName().c_str())) {
    if (_optDelta.SetValue(optionValue)) {
      _delta = static_cast<int>(_optDelta.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optEXT.GetName().c_str())) {
    if (_optEXT.SetValue(optionValue)) {
      _ext = (_optEXT.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optFutility.GetName().c_str())) {
    if (_optFutility.SetValue(optionValue)) {
      _futility = static_cast<int>(_optFutility.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optIID.GetName().c_str())) {
    if (_optIID.SetValue(optionValue)) {
      _iid = (_optIID.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optLMR.GetName().c_str())) {
    if (_optLMR.SetValue(optionValue)) {
      _lmr = (_optLMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optNMP.GetName().c_str())) {
    if (_optNMP.SetValue(optionValue)) {
      _nmp = (_optNMP.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optNMR.GetName().c_str())) {
    if (_optNMR.SetValue(optionValue)) {
      _nmr = (_optNMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optOneReply.GetName().c_str())) {
    if (_optOneReply.SetValue(optionValue)) {
      _oneReply = (_optOneReply.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optRZR.GetName().c_str())) {
    if (_optRZR.SetValue(optionValue)) {
      _rzr = static_cast<int>(_optRZR.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTempo.GetName().c_str())) {
    if (_optTempo.SetValue(optionValue)) {
      _tempo = static_cast<int>(_optTempo.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTest.GetName().c_str())) {
    if (_optTest.SetValue(optionValue)) {
      _test = static_cast<int>(_optTest.GetIntValue());
      return true;
    }
  }
  return false;
}